

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

long __thiscall
gl4cts::anon_unknown_0::AdvancedSyncDrawIndirect::Cleanup(AdvancedSyncDrawIndirect *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_draw_command_buffer);
  glu::CallLogWrapper::glDeleteTextures(this_00,1,&this->m_draw_command_buffer_tex);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->m_store_program);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->m_draw_program);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&this->m_attribless_vao);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&this->m_draw_vao);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_draw_vbo);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glUseProgram(0);
		glDeleteBuffers(1, &m_draw_command_buffer);
		glDeleteTextures(1, &m_draw_command_buffer_tex);
		glDeleteProgram(m_store_program);
		glDeleteProgram(m_draw_program);
		glDeleteVertexArrays(1, &m_attribless_vao);
		glDeleteVertexArrays(1, &m_draw_vao);
		glDeleteBuffers(1, &m_draw_vbo);
		return NO_ERROR;
	}